

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O2

int s_mp_sub(mp_int *a,mp_int *b,mp_int *c)

{
  uint uVar1;
  int size;
  mp_digit mVar2;
  mp_digit mVar3;
  int iVar4;
  mp_digit *pmVar5;
  long lVar6;
  ulong uVar7;
  mp_digit *pmVar8;
  ulong uVar9;
  mp_digit *pmVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  
  uVar1 = b->used;
  size = a->used;
  if ((c->alloc < size) && (iVar4 = mp_grow(c,size), iVar4 != 0)) {
    return iVar4;
  }
  iVar4 = c->used;
  c->used = size;
  pmVar8 = a->dp;
  pmVar10 = b->dp;
  pmVar5 = c->dp;
  uVar9 = 0;
  uVar7 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar7 = uVar9;
  }
  for (iVar12 = 0; iVar12 != (int)uVar7; iVar12 = iVar12 + 1) {
    mVar2 = *pmVar8;
    pmVar8 = pmVar8 + 1;
    mVar3 = *pmVar10;
    pmVar10 = pmVar10 + 1;
    uVar13 = mVar2 - (uVar9 + mVar3);
    uVar9 = uVar13 >> 0x3f;
    *pmVar5 = uVar13 & 0xfffffffffffffff;
    pmVar5 = pmVar5 + 1;
  }
  lVar11 = 0;
  for (; (int)uVar7 < size; uVar7 = (ulong)((int)uVar7 + 1)) {
    uVar13 = *(long *)((long)pmVar8 + lVar11) - uVar9;
    uVar9 = uVar13 >> 0x3f;
    *(ulong *)((long)pmVar5 + lVar11) = uVar13 & 0xfffffffffffffff;
    lVar11 = lVar11 + 8;
  }
  for (lVar6 = 0; size + (int)lVar6 < iVar4; lVar6 = lVar6 + 1) {
    *(undefined8 *)((long)pmVar5 + lVar6 * 8 + lVar11) = 0;
  }
  mp_clamp(c);
  return 0;
}

Assistant:

int s_mp_sub (mp_int * a, mp_int * b, mp_int * c)
{
  int     olduse, res, min, max;

  /* find sizes */
  min = b->used;
  max = a->used;

  /* init result */
  if (c->alloc < max) {
    if ((res = mp_grow (c, max)) != MP_OKAY) {
      return res;
    }
  }
  olduse = c->used;
  c->used = max;

  {
    register mp_digit u, *tmpa, *tmpb, *tmpc;
    register int i;

    /* alias for digit pointers */
    tmpa = a->dp;
    tmpb = b->dp;
    tmpc = c->dp;

    /* set carry to zero */
    u = 0;
    for (i = 0; i < min; i++) {
      /* T[i] = A[i] - B[i] - U */
      *tmpc = *tmpa++ - *tmpb++ - u;

      /* U = carry bit of T[i]
       * Note this saves performing an AND operation since
       * if a carry does occur it will propagate all the way to the
       * MSB.  As a result a single shift is enough to get the carry
       */
      u = *tmpc >> ((mp_digit)(CHAR_BIT * sizeof (mp_digit) - 1));

      /* Clear carry from T[i] */
      *tmpc++ &= MP_MASK;
    }

    /* now copy higher words if any, e.g. if A has more digits than B  */
    for (; i < max; i++) {
      /* T[i] = A[i] - U */
      *tmpc = *tmpa++ - u;

      /* U = carry bit of T[i] */
      u = *tmpc >> ((mp_digit)(CHAR_BIT * sizeof (mp_digit) - 1));

      /* Clear carry from T[i] */
      *tmpc++ &= MP_MASK;
    }

    /* clear digits above used (since we may not have grown result above) */
    for (i = c->used; i < olduse; i++) {
      *tmpc++ = 0;
    }
  }

  mp_clamp (c);
  return MP_OKAY;
}